

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O0

spv_result_t
spvtools::val::FindCaseFallThrough
          (ValidationState_t *_,BasicBlock *target_block,uint32_t *case_fall_through,
          BasicBlock *merge,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *case_targets,Function *function)

{
  BasicBlock *pBVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  reference ppBVar5;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *this;
  reference ppBVar6;
  size_type sVar7;
  Instruction *pIVar8;
  DiagnosticStream *pDVar9;
  pair<std::__detail::_Node_iterator<const_spvtools::val::BasicBlock_*,_true,_false>,_bool> pVar10;
  string local_540;
  string local_520;
  string local_500;
  DiagnosticStream local_4e0;
  undefined4 local_304;
  string local_300;
  string local_2e0;
  DiagnosticStream local_2c0;
  int local_e8;
  uint32_t local_e4;
  int depth;
  BasicBlock *successor;
  iterator __end4;
  iterator __begin4;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *__range4;
  value_type local_a0;
  value_type block;
  int target_depth;
  bool target_reachable;
  unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
  visited;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> stack;
  Function *function_local;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *case_targets_local;
  BasicBlock *merge_local;
  uint32_t *case_fall_through_local;
  BasicBlock *target_block_local;
  ValidationState_t *__local;
  
  case_fall_through_local = &target_block->id_;
  target_block_local = (BasicBlock *)_;
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::vector
            ((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *)
             &visited._M_h._M_single_bucket);
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::push_back
            ((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *)
             &visited._M_h._M_single_bucket,(value_type *)&case_fall_through_local);
  std::
  unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
  ::unordered_set((unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                   *)&target_depth);
  block._7_1_ = BasicBlock::structurally_reachable((BasicBlock *)case_fall_through_local);
  block._0_4_ = Function::GetBlockDepth(function,(BasicBlock *)case_fall_through_local);
  do {
    while( true ) {
      while( true ) {
        do {
          bVar2 = std::
                  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                  ::empty((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                           *)&visited._M_h._M_single_bucket);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            __local._4_4_ = SPV_SUCCESS;
            goto LAB_002aafd3;
          }
          ppBVar5 = std::
                    vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                    ::back((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                            *)&visited._M_h._M_single_bucket);
          local_a0 = *ppBVar5;
          std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
          pop_back((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                    *)&visited._M_h._M_single_bucket);
        } while ((local_a0 == merge) ||
                (pVar10 = std::
                          unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                          ::insert((unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                                    *)&target_depth,&local_a0), ((pVar10.second ^ 0xffU) & 1) != 0))
        ;
        if (((block._7_1_ & 1) == 0) ||
           ((bVar2 = BasicBlock::structurally_reachable(local_a0), !bVar2 ||
            (bVar2 = BasicBlock::structurally_dominates
                               ((BasicBlock *)case_fall_through_local,local_a0), !bVar2)))) break;
        this = BasicBlock::successors(local_a0);
        __end4 = std::
                 vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
                 begin(this);
        successor = (BasicBlock *)
                    std::
                    vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                    ::end(this);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                                           *)&successor), bVar2) {
          ppBVar6 = __gnu_cxx::
                    __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                    ::operator*(&__end4);
          _depth = *ppBVar6;
          std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
          push_back((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                     *)&visited._M_h._M_single_bucket,(value_type *)&depth);
          __gnu_cxx::
          __normal_iterator<spvtools::val::BasicBlock_**,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
          ::operator++(&__end4);
        }
      }
      local_e4 = BasicBlock::id(local_a0);
      sVar7 = std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::count(case_targets,&local_e4);
      if (sVar7 == 0) break;
      if (*case_fall_through == 0) {
        if ((value_type)case_fall_through_local != local_a0) {
          uVar3 = BasicBlock::id(local_a0);
          *case_fall_through = uVar3;
        }
      }
      else {
        uVar3 = *case_fall_through;
        uVar4 = BasicBlock::id(local_a0);
        pBVar1 = target_block_local;
        if (uVar3 != uVar4) {
          pIVar8 = BasicBlock::label((BasicBlock *)case_fall_through_local);
          ValidationState_t::diag
                    (&local_4e0,(ValidationState_t *)pBVar1,SPV_ERROR_INVALID_CFG,pIVar8);
          pDVar9 = DiagnosticStream::operator<<
                             (&local_4e0,(char (*) [29])"Case construct that targets ");
          pBVar1 = target_block_local;
          uVar3 = BasicBlock::id((BasicBlock *)case_fall_through_local);
          ValidationState_t::getIdName_abi_cxx11_(&local_500,(ValidationState_t *)pBVar1,uVar3);
          pDVar9 = DiagnosticStream::operator<<(pDVar9,&local_500);
          pDVar9 = DiagnosticStream::operator<<
                             (pDVar9,(char (*) [56])
                                     " has branches to multiple other case construct targets ");
          ValidationState_t::getIdName_abi_cxx11_
                    (&local_520,(ValidationState_t *)target_block_local,*case_fall_through);
          pDVar9 = DiagnosticStream::operator<<(pDVar9,&local_520);
          pDVar9 = DiagnosticStream::operator<<(pDVar9,(char (*) [6])0x3df52d);
          pBVar1 = target_block_local;
          uVar3 = BasicBlock::id(local_a0);
          ValidationState_t::getIdName_abi_cxx11_(&local_540,(ValidationState_t *)pBVar1,uVar3);
          pDVar9 = DiagnosticStream::operator<<(pDVar9,&local_540);
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
          std::__cxx11::string::~string((string *)&local_540);
          std::__cxx11::string::~string((string *)&local_520);
          std::__cxx11::string::~string((string *)&local_500);
          DiagnosticStream::~DiagnosticStream(&local_4e0);
          goto LAB_002aafd3;
        }
      }
    }
    local_e8 = Function::GetBlockDepth(function,local_a0);
  } while ((local_e8 < (int)block) ||
          ((local_e8 == (int)block &&
           (bVar2 = BasicBlock::is_type(local_a0,kBlockTypeContinue), bVar2))));
  pBVar1 = target_block_local;
  pIVar8 = BasicBlock::label((BasicBlock *)case_fall_through_local);
  ValidationState_t::diag(&local_2c0,(ValidationState_t *)pBVar1,SPV_ERROR_INVALID_CFG,pIVar8);
  pDVar9 = DiagnosticStream::operator<<(&local_2c0,(char (*) [29])"Case construct that targets ");
  pBVar1 = target_block_local;
  uVar3 = BasicBlock::id((BasicBlock *)case_fall_through_local);
  ValidationState_t::getIdName_abi_cxx11_(&local_2e0,(ValidationState_t *)pBVar1,uVar3);
  pDVar9 = DiagnosticStream::operator<<(pDVar9,&local_2e0);
  pDVar9 = DiagnosticStream::operator<<(pDVar9,(char (*) [30])" has invalid branch to block ");
  pBVar1 = target_block_local;
  uVar3 = BasicBlock::id(local_a0);
  ValidationState_t::getIdName_abi_cxx11_(&local_300,(ValidationState_t *)pBVar1,uVar3);
  pDVar9 = DiagnosticStream::operator<<(pDVar9,&local_300);
  pDVar9 = DiagnosticStream::operator<<
                     (pDVar9,(char (*) [92])
                             " (not another case construct, corresponding merge, outer loop merge or outer loop continue)"
                     );
  __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar9);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_2e0);
  DiagnosticStream::~DiagnosticStream(&local_2c0);
LAB_002aafd3:
  local_304 = 1;
  std::
  unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
  ::~unordered_set((unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                    *)&target_depth);
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::~vector
            ((vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *)
             &visited._M_h._M_single_bucket);
  return __local._4_4_;
}

Assistant:

spv_result_t FindCaseFallThrough(
    ValidationState_t& _, BasicBlock* target_block, uint32_t* case_fall_through,
    const BasicBlock* merge, const std::unordered_set<uint32_t>& case_targets,
    Function* function) {
  std::vector<BasicBlock*> stack;
  stack.push_back(target_block);
  std::unordered_set<const BasicBlock*> visited;
  bool target_reachable = target_block->structurally_reachable();
  int target_depth = function->GetBlockDepth(target_block);
  while (!stack.empty()) {
    auto block = stack.back();
    stack.pop_back();

    if (block == merge) continue;

    if (!visited.insert(block).second) continue;

    if (target_reachable && block->structurally_reachable() &&
        target_block->structurally_dominates(*block)) {
      // Still in the case construct.
      for (auto successor : *block->successors()) {
        stack.push_back(successor);
      }
    } else {
      // Exiting the case construct to non-merge block.
      if (!case_targets.count(block->id())) {
        int depth = function->GetBlockDepth(block);
        if ((depth < target_depth) ||
            (depth == target_depth && block->is_type(kBlockTypeContinue))) {
          continue;
        }

        return _.diag(SPV_ERROR_INVALID_CFG, target_block->label())
               << "Case construct that targets "
               << _.getIdName(target_block->id())
               << " has invalid branch to block " << _.getIdName(block->id())
               << " (not another case construct, corresponding merge, outer "
                  "loop merge or outer loop continue)";
      }

      if (*case_fall_through == 0u) {
        if (target_block != block) {
          *case_fall_through = block->id();
        }
      } else if (*case_fall_through != block->id()) {
        // Case construct has at most one branch to another case construct.
        return _.diag(SPV_ERROR_INVALID_CFG, target_block->label())
               << "Case construct that targets "
               << _.getIdName(target_block->id())
               << " has branches to multiple other case construct targets "
               << _.getIdName(*case_fall_through) << " and "
               << _.getIdName(block->id());
      }
    }
  }

  return SPV_SUCCESS;
}